

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFMatrix.cpp
# Opt level: O0

void __thiscall PDFMatrix::PDFMatrix(PDFMatrix *this)

{
  PDFMatrix *this_local;
  
  this->a = 1.0;
  this->b = 0.0;
  this->c = 0.0;
  this->d = 1.0;
  this->e = 0.0;
  this->f = 0.0;
  return;
}

Assistant:

PDFMatrix::PDFMatrix(void) {
    a = 1;
    b = 0;
    c = 0;
    d = 1;
    e = 0;
    f = 0;
}